

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *string;
  char **strings;
  char *filepath;
  int iVar1;
  int iVar2;
  SolveStatus SVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  cJSON_bool cVar30;
  cJSON_bool cVar31;
  cJSON_bool cVar32;
  cJSON_bool cVar33;
  cJSON_bool cVar34;
  arg_dbl *paVar35;
  arg_int *paVar36;
  arg_lit *paVar37;
  arg_str *paVar38;
  arg_str *paVar39;
  arg_int *paVar40;
  arg_file *paVar41;
  arg_lit *paVar42;
  arg_lit *paVar43;
  arg_file *paVar44;
  arg_file *paVar45;
  arg_file *paVar46;
  arg_end *end;
  FILE *__stream;
  time_t tVar47;
  char *pcVar48;
  int64_t iVar49;
  time_t tVar50;
  char *pcVar51;
  FILE *pFVar52;
  cJSON *object;
  cJSON *pcVar53;
  cJSON *pcVar54;
  char *pcVar55;
  size_t sVar56;
  cJSON *item;
  undefined8 extraout_RAX;
  byte bVar57;
  uint uVar58;
  int level;
  ulong uVar59;
  char *__filename;
  long lVar60;
  bool bVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  Instance instance;
  void *argtable [13];
  SolverParams params;
  char timerepr_str [4096];
  ulong local_21c0;
  SolveStatus local_21b8;
  SolveStatus local_2178;
  Solution local_2150;
  Instance local_2128;
  double local_20e0;
  time_t local_20d8;
  time_t local_20d0;
  long local_20c8;
  TimeRepr local_20c0;
  arg_lit *local_20a8;
  arg_lit *local_20a0;
  arg_int *local_2098;
  arg_file *local_2090;
  arg_lit *local_2088;
  arg_dbl *local_2080;
  arg_int *local_2078;
  arg_str *local_2070;
  arg_file *local_2068;
  arg_file *local_2060;
  arg_file *local_2058;
  arg_str *local_2050;
  arg_end *local_2048;
  SolverParams local_2040;
  TimeRepr local_1038 [171];
  
  pcVar55 = *argv;
  if (argc == 1) {
    printf("%s: %s\n",PROJECT_NAME,PROJECT_DESCRIPTION);
    print_version();
    putchar(10);
    printf("Try \'%s --help\' for more information.\n",pcVar55);
    return 1;
  }
  paVar35 = arg_dbl0("t","timelimit",(char *)0x0,
                     "define the maximum timelimit in seconds (default 10 minutes)");
  paVar36 = arg_int0("s","seed",(char *)0x0,
                     "define the random seed to use (default is 0, eg compute it from the current time)"
                    );
  paVar37 = arg_lit0("a","treat-sigterm-as-failure",
                     "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit with non zero exit status. The JSON report output file will not be generated"
                    );
  paVar38 = arg_strn("D","define","KEY=VALUE",0,argc + 2,"define parameters");
  paVar39 = arg_str0("S","solver","SOLVER","solver to use (default \"mip\")");
  paVar40 = arg_int0((char *)0x0,"loglvl",(char *)0x0,
                     "control the log level (0: fatal&warning logs, 1: info logs, 2: trace logs, 3: debug logs (only in debug builds)"
                    );
  paVar41 = arg_file0("l","log",(char *)0x0,
                      "specify an additional file where logs would be stored (default none)");
  paVar42 = arg_lit0((char *)0x0,"help","print this help and exit");
  paVar43 = arg_lit0((char *)0x0,"version","print version information and exit");
  paVar44 = arg_file1("i","instance",(char *)0x0,"input instance file");
  paVar45 = arg_file0((char *)0x0,"visualize",(char *)0x0,"tour visualization output file");
  paVar46 = arg_file0("w","write-report",(char *)0x0,"write a JSON report output file.");
  end = arg_end(0x10);
  local_20a8 = paVar42;
  local_20a0 = paVar43;
  local_2098 = paVar40;
  local_2090 = paVar41;
  local_2088 = paVar37;
  local_2080 = paVar35;
  local_2078 = paVar36;
  local_2070 = paVar38;
  local_2068 = paVar44;
  local_2060 = paVar45;
  local_2058 = paVar46;
  local_2050 = paVar39;
  local_2048 = end;
  iVar1 = arg_nullcheck(&local_20a8);
  if (iVar1 != 0) {
    __stream = (FILE *)0x0;
    printf("%s: insufficient memory\n",pcVar55);
LAB_00102aa3:
    uVar58 = 1;
    goto LAB_00103b52;
  }
  *paVar35->dval = 600.0;
  *paVar36->ival = 0;
  *paVar39->sval = "mip";
  *paVar41->filename = (char *)0x0;
  *paVar45->filename = (char *)0x0;
  *paVar46->filename = (char *)0x0;
  *paVar40->ival = 0;
  iVar1 = arg_parse(argc,argv,&local_20a8);
  if (paVar42->count < 1) {
    if (iVar1 < 1) {
      uVar58 = 0;
      bVar61 = true;
    }
    else {
      arg_print_errors((FILE *)_stdout,end,pcVar55);
      bVar61 = false;
      printf("Try \'%s --help\' for more information.\n",pcVar55);
      uVar58 = 1;
    }
  }
  else {
    bVar61 = false;
    printf("%s: %s\n",PROJECT_NAME,PROJECT_DESCRIPTION);
    printf("Usage: %s",pcVar55);
    arg_print_syntax((FILE *)_stdout,&local_20a8,"\n");
    arg_print_glossary((FILE *)_stdout,&local_20a8,"  %-32s %s\n");
    cptp_print_list_of_solvers_and_params();
    uVar58 = 0;
  }
  if (!bVar61) {
    __stream = (FILE *)0x0;
    goto LAB_00103b52;
  }
  if (0 < paVar43->count) {
    print_version();
    __stream = (FILE *)0x0;
    uVar58 = 0;
    goto LAB_00103b52;
  }
  iVar1 = *paVar40->ival;
  iVar2 = 0x20;
  if (iVar1 != 1) {
    iVar2 = (uint)(iVar1 == 2) * 0x20 + -0x20;
  }
  level = 0x40;
  if (0 < iVar1) {
    level = iVar2;
  }
  log_set_level(level);
  if (paVar41->count < 1) {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(*paVar41->filename,"w");
    if (__stream == (FILE *)0x0) {
      main_cold_1();
      __stream = (FILE *)0x0;
    }
    else {
      log_add_fp((FILE *)__stream,level);
    }
  }
  iVar1 = paVar37->count;
  pcVar55 = *paVar44->filename;
  string = *paVar39->sval;
  dVar62 = *paVar35->dval;
  uVar58 = *paVar36->ival;
  strings = paVar38->sval;
  uVar6 = paVar38->count;
  filepath = *paVar45->filename;
  __filename = *paVar46->filename;
  if (uVar58 == 0) {
    tVar47 = time((time_t *)0x0);
    uVar58 = (int)tVar47 +
             ((int)(SUB168(SEXT816(tVar47) * ZEXT816(0x8000000100000003),8) >> 0x1e) -
             (SUB164(SEXT816(tVar47) * ZEXT816(0x8000000100000003),0xc) >> 0x1f)) * -0x7fffffff;
  }
  local_21c0 = (ulong)uVar58;
  parse(&local_2128,pcVar55);
  if ((((local_2128.num_customers < 1) || (local_2128.num_vehicles < 1)) ||
      (local_2128.vehicle_cap <= 0.0)) || (local_2128.demands == (double *)0x0)) {
    fprintf(_stderr,"%s: Failed to parse file\n",pcVar55);
    goto LAB_00102aa3;
  }
  memset(&local_2040,0,0x1008);
  if (0x100 < (int)uVar6) {
    main_cold_2();
    printf("%s v%s (%s, revision: %s)\n",PROJECT_NAME,PROJECT_VERSION,GIT_DATE,GIT_SHA1);
    iVar1 = printf("Compiled with %s v%s (%s), %s build\n",C_COMPILER_ID,C_COMPILER_VERSION,
                   C_COMPILER_ABI,BUILD_TYPE,extraout_RAX);
    return iVar1;
  }
  if (0 < (int)uVar6) {
    lVar60 = 0;
    do {
      pcVar51 = *(char **)((long)strings + lVar60);
      pcVar48 = strchr(pcVar51,0x3d);
      if (pcVar48 == (char *)0x0) {
        sVar56 = strlen(pcVar51);
        pcVar48 = pcVar51 + sVar56;
      }
      else {
        *pcVar48 = '\0';
        pcVar48 = pcVar48 + 1;
      }
      *(char **)((long)&local_2040.params[0].name + lVar60 * 2) = pcVar51;
      *(char **)((long)&local_2040.params[0].value + lVar60 * 2) = pcVar48;
      lVar60 = lVar60 + 8;
    } while ((ulong)uVar6 * 8 - lVar60 != 0);
    local_2040.num_params = local_2040.num_params + uVar6;
  }
  solution_create(&local_2150,&local_2128);
  tVar47 = time((time_t *)0x0);
  iVar49 = os_get_nanosecs();
  lVar60 = SUB168(SEXT816(iVar49) * SEXT816(-0x20c49ba5e353f7cf),8);
  pcVar51 = "mip";
  if (string != (char *)0x0) {
    pcVar51 = string;
  }
  SVar3 = cptp_solve(&local_2128,pcVar51,&local_2040,&local_2150,dVar62,uVar58);
  tVar50 = time((time_t *)0x0);
  iVar49 = os_get_nanosecs();
  lVar60 = iVar49 / 1000 + ((lVar60 >> 7) - (lVar60 >> 0x3f));
  bVar61 = SVar3 == SOLVE_STATUS_NULL;
  puts("\n\n###\n###\n###\n");
  pFVar52 = _stdout;
  local_20c0._0_8_ = tVar47;
  local_20c0._8_8_ = tVar50;
  local_20c0._16_8_ = lVar60;
  fprintf(_stdout,"%-16s %s\n","SOLVER:",string);
  fprintf(pFVar52,"%-16s %f\n",dVar62,"TIMELIM:");
  fprintf(pFVar52,"%-16s %d\n","SEED:",local_21c0);
  fprintf(pFVar52,"%-16s %s\n","INPUT:",pcVar55);
  fprintf(pFVar52,"%-16s %.17g\n",local_2128.vehicle_cap,"VEHICLE_CAP:");
  fprintf(pFVar52,"%-16s 0x%x\n","STATUS:",(ulong)SVar3);
  if ((SVar3 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar61) {
    printf("%-16s [%.17g, %.17g]\n",local_2150.dual_bound,local_2150.primal_bound,"BOUNDS:");
    printf("%-16s %.17g\n",
           (local_2150.primal_bound - local_2150.dual_bound) /
           (ABS(local_2150.primal_bound) + 1e-10),"GAP");
    if ((SVar3 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) != SOLVE_STATUS_NULL) {
      printf("%-16s ");
      uVar59 = 0;
      do {
        if (((int)uVar59 < 0) || (local_2150.tour.num_customers < (int)uVar59)) goto LAB_001031b5;
        uVar4 = local_2150.tour.succ[uVar59];
        pcVar51 = "%d";
        if (uVar4 != 0) {
          pcVar51 = "%d ";
        }
        printf(pcVar51);
        uVar59 = (ulong)uVar4;
      } while (uVar4 != 0);
      putchar(10);
      goto LAB_001030e0;
    }
  }
  else {
    printf("%-16s Could not solve\n","ERR:");
LAB_001030e0:
    if ((SVar3 & (SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL|SOLVE_STATUS_ERR)) ==
        SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) {
      tour_eval(&local_2128,&local_2150.tour);
      if (local_2150.tour.num_customers < 0) goto LAB_001031b5;
      dVar64 = 0.0;
      dVar63 = 0.0;
      if (-1 < *local_2150.tour.comp) {
        dVar63 = *local_2128.demands + 0.0;
        uVar4 = 0;
        do {
          uVar5 = local_2150.tour.succ[uVar4];
          if ((ulong)uVar5 == 0) goto LAB_0010316c;
          if ((int)uVar5 < 0) goto LAB_00103bb6;
          if (uVar5 == uVar4) goto LAB_00103b97;
          dVar63 = dVar63 + local_2128.demands[uVar5];
          uVar4 = uVar5;
        } while (uVar5 <= (uint)local_2150.tour.num_customers);
        goto LAB_001031b5;
      }
LAB_0010316c:
      if (-1 < *local_2150.tour.comp) {
        dVar64 = *local_2128.profits + 0.0;
        uVar4 = 0;
        do {
          uVar5 = local_2150.tour.succ[uVar4];
          if ((ulong)uVar5 == 0) goto LAB_001031d4;
          if ((int)uVar5 < 0) goto LAB_00103bf4;
          if (uVar5 == uVar4) goto LAB_00103bd5;
          dVar64 = dVar64 + local_2128.profits[uVar5];
          uVar4 = uVar5;
        } while (uVar5 <= (uint)local_2150.tour.num_customers);
        goto LAB_001031b5;
      }
LAB_001031d4:
      local_20e0 = dVar64;
      printf("%-16s %.17g\n","TOUR COST:");
      printf("%-16s %.17g\n",local_20e0,"TOUR PROFIT:");
      printf("%-16s %.17g   (%.3g%%)\n",dVar63,(dVar63 / local_2128.vehicle_cap) * 100.0,
             "TOUR DEMAND:");
    }
  }
  bVar57 = 0 < iVar1 & (byte)((SVar3 & SOLVE_STATUS_ABORTION_SIGTERM) >> 4);
  pcVar51 = ctime((time_t *)&local_20c0);
  printf("%-16s %s","STARTED:",pcVar51);
  pcVar51 = ctime((time_t *)&local_20c0.minutes);
  printf("%-16s %s","ENDED:",pcVar51);
  printf("%-16s ","TOOK:");
  timerepr_from_usecs(local_1038,local_20c0._16_8_);
  print_timerepr((FILE *)_stdout,local_1038);
  putchar(10);
  pcVar51 = "TRUE";
  if (bVar57 != 0 || ((SVar3 & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL || bVar61)) {
    pcVar51 = "FALSE";
  }
  printf("%-16s %s\n","SUCCESS",pcVar51);
  if (bVar57 == 0 && ((SVar3 & SOLVE_STATUS_ERR) == SOLVE_STATUS_NULL && !bVar61)) {
    local_20d8 = tVar47;
    local_20d0 = tVar50;
    local_20c8 = lVar60;
    if (__filename != (char *)0x0) {
      pFVar52 = fopen(__filename,"w");
      if (pFVar52 == (FILE *)0x0) {
        pcVar55 = "%s: failed to open file for writing JSON report";
        iVar1 = 0x99;
LAB_0010390e:
        object = (cJSON *)0x0;
        log_log(0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                ,iVar1,pcVar55,__filename);
      }
      else {
        object = cJSON_CreateObject();
        if (object == (cJSON *)0x0) {
          pcVar55 = "%s :: Failed to create JSON root object";
          __filename = "writeout_json_report";
          iVar1 = 0x9f;
          goto LAB_0010390e;
        }
        local_2178 = SVar3 & SOLVE_STATUS_ERR;
        local_21b8 = SVar3 & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL;
        pcVar53 = cJSON_CreateString(string);
        uVar4 = cJSON_AddItemToObject(object,"solverName",pcVar53);
        pcVar53 = cJSON_CreateNumber(dVar62);
        uVar5 = cJSON_AddItemToObject(object,"timeLimit",pcVar53);
        pcVar53 = cJSON_CreateNumber((double)(int)uVar58);
        uVar58 = cJSON_AddItemToObject(object,"randomSeed",pcVar53);
        pcVar53 = cJSON_CreateStringArray(strings,uVar6);
        uVar6 = cJSON_AddItemToObject(object,"cmdLineDefines",pcVar53);
        pcVar53 = cJSON_CreateString(pcVar55);
        uVar7 = cJSON_AddItemToObject(object,"inputFile",pcVar53);
        pcVar53 = cJSON_CreateObject();
        uVar8 = cJSON_AddItemToObject(object,"instanceInfo",pcVar53);
        if (local_2128.name == (char *)0x0) {
          local_2128.name = "";
        }
        pcVar54 = cJSON_CreateString(local_2128.name);
        uVar9 = cJSON_AddItemToObject(pcVar53,"name",pcVar54);
        if (local_2128.comment == (char *)0x0) {
          local_2128.comment = "";
        }
        pcVar54 = cJSON_CreateString(local_2128.comment);
        uVar10 = cJSON_AddItemToObject(pcVar53,"comment",pcVar54);
        pcVar54 = cJSON_CreateNumber(local_2128.vehicle_cap);
        uVar11 = cJSON_AddItemToObject(pcVar53,"vehicleCap",pcVar54);
        pcVar54 = cJSON_CreateNumber((double)local_2128.num_customers);
        uVar12 = cJSON_AddItemToObject(pcVar53,"numCustomers",pcVar54);
        pcVar54 = cJSON_CreateNumber((double)local_2128.num_vehicles);
        uVar13 = cJSON_AddItemToObject(pcVar53,"numVehicles",pcVar54);
        pcVar53 = cJSON_CreateObject();
        uVar14 = cJSON_AddItemToObject(object,"solveStatus",pcVar53);
        pcVar54 = cJSON_CreateNumber((double)SVar3);
        uVar15 = cJSON_AddItemToObject(pcVar53,"code",pcVar54);
        pcVar54 = cJSON_CreateBool(local_2178);
        uVar16 = cJSON_AddItemToObject(pcVar53,"erroredOut",pcVar54);
        pcVar54 = cJSON_CreateBool(local_21b8 >> 2);
        uVar17 = cJSON_AddItemToObject(pcVar53,"containsPrimalSolution",pcVar54);
        pcVar54 = cJSON_CreateBool(SVar3 >> 1 & 1);
        uVar18 = cJSON_AddItemToObject(pcVar53,"closedProblem",pcVar54);
        pcVar54 = cJSON_CreateBool(SVar3 >> 3 & 1);
        uVar19 = cJSON_AddItemToObject(pcVar53,"resExhaustionAbortion",pcVar54);
        pcVar54 = cJSON_CreateBool(SVar3 >> 4 & 1);
        uVar20 = cJSON_AddItemToObject(pcVar53,"sigTermAbortion",pcVar54);
        pcVar53 = cJSON_CreateObject();
        uVar21 = cJSON_AddItemToObject(object,"timingInfo",pcVar53);
        timerepr_from_usecs(&local_20c0,local_20c8);
        timerepr_to_string(&local_20c0,(char *)local_1038,0x1000);
        pcVar54 = cJSON_CreateNumber((double)local_20c8 * 1e-06);
        uVar22 = cJSON_AddItemToObject(pcVar53,"took",pcVar54);
        pcVar54 = cJSON_CreateString((char *)local_1038);
        uVar23 = cJSON_AddItemToObject(pcVar53,"tookRepr",pcVar54);
        pcVar55 = ctime(&local_20d8);
        sVar56 = strlen(pcVar55);
        pcVar55[sVar56 - 1] = '\0';
        pcVar54 = cJSON_CreateString(pcVar55);
        uVar24 = cJSON_AddItemToObject(pcVar53,"started",pcVar54);
        pcVar55 = ctime(&local_20d0);
        sVar56 = strlen(pcVar55);
        pcVar55[sVar56 - 1] = '\0';
        pcVar54 = cJSON_CreateString(pcVar55);
        uVar25 = cJSON_AddItemToObject(pcVar53,"ended",pcVar54);
        pcVar53 = cJSON_CreateObject();
        uVar26 = cJSON_AddItemToObject(object,"bounds",pcVar53);
        pcVar54 = cJSON_CreateNumber(local_2150.dual_bound);
        uVar27 = cJSON_AddItemToObject(pcVar53,"dual",pcVar54);
        pcVar54 = cJSON_CreateNumber(local_2150.primal_bound);
        uVar28 = cJSON_AddItemToObject(pcVar53,"primal",pcVar54);
        pcVar54 = cJSON_CreateNumber((local_2150.primal_bound - local_2150.dual_bound) /
                                     (ABS(local_2150.primal_bound) + 1e-10));
        uVar29 = cJSON_AddItemToObject(pcVar53,"gap",pcVar54);
        uVar29 = uVar29 & uVar28 & uVar27 & uVar26 & uVar25 &
                          uVar24 & uVar23 & uVar21 & uVar20 & uVar19 & uVar18 & uVar17 & uVar16 & 
                                                  uVar15 & uVar14 &
                                                  uVar13 & uVar12 &
                                                  uVar11 & uVar10 &
                                                  uVar9 & uVar8 & uVar7 & uVar6 & uVar5 & uVar4 &
                                                          uVar58 & uVar22;
        if (local_21b8 != SOLVE_STATUS_NULL) {
          pcVar53 = cJSON_CreateObject();
          cVar30 = cJSON_AddItemToObject(object,"tourInfo",pcVar53);
          dVar62 = tour_eval(&local_2128,&local_2150.tour);
          if (local_2150.tour.num_customers < 0) {
LAB_001031b5:
            __assert_fail("idx >= 0 && idx < len",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                          ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
          }
          dVar63 = 0.0;
          dVar64 = 0.0;
          if (-1 < *local_2150.tour.comp) {
            dVar64 = *local_2128.profits + 0.0;
            uVar58 = 0;
            do {
              uVar6 = local_2150.tour.succ[uVar58];
              if ((ulong)uVar6 == 0) goto LAB_0010393a;
              if ((int)uVar6 < 0) {
LAB_00103bf4:
                __assert_fail("next_vertex >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0xa9,"double tour_profit(const Instance *, Tour *)");
              }
              if (uVar6 == uVar58) {
LAB_00103bd5:
                __assert_fail("next_vertex != curr_vertex",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0xaa,"double tour_profit(const Instance *, Tour *)");
              }
              dVar64 = dVar64 + local_2128.profits[uVar6];
              uVar58 = uVar6;
            } while (uVar6 <= (uint)local_2150.tour.num_customers);
            goto LAB_001031b5;
          }
LAB_0010393a:
          if (-1 < *local_2150.tour.comp) {
            dVar63 = *local_2128.demands + 0.0;
            uVar58 = 0;
            do {
              uVar6 = local_2150.tour.succ[uVar58];
              if ((ulong)uVar6 == 0) goto LAB_00103988;
              if ((int)uVar6 < 0) {
LAB_00103bb6:
                __assert_fail("next_vertex >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0x98,"double tour_demand(const Instance *, Tour *)");
              }
              if (uVar6 == uVar58) {
LAB_00103b97:
                __assert_fail("next_vertex != curr_vertex",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0x99,"double tour_demand(const Instance *, Tour *)");
              }
              dVar63 = dVar63 + local_2128.demands[uVar6];
              uVar58 = uVar6;
            } while (uVar6 <= (uint)local_2150.tour.num_customers);
            goto LAB_001031b5;
          }
LAB_00103988:
          pcVar54 = cJSON_CreateNumber(dVar62);
          cVar31 = cJSON_AddItemToObject(pcVar53,"cost",pcVar54);
          pcVar54 = cJSON_CreateNumber(dVar64);
          cVar32 = cJSON_AddItemToObject(pcVar53,"profit",pcVar54);
          pcVar54 = cJSON_CreateNumber(dVar63);
          cVar33 = cJSON_AddItemToObject(pcVar53,"demand",pcVar54);
          pcVar54 = cJSON_CreateArray();
          uVar58 = 0;
          do {
            if (((int)uVar58 < 0) || (local_2150.tour.num_customers < (int)uVar58))
            goto LAB_001031b5;
            uVar6 = local_2150.tour.succ[uVar58];
            item = cJSON_CreateNumber((double)(int)uVar58);
            cJSON_AddItemToArray(pcVar54,item);
            uVar58 = uVar6;
          } while (uVar6 != 0);
          cVar34 = cJSON_AddItemToObject(pcVar53,"route",pcVar54);
          uVar29 = (uint)(byte)((byte)cVar33 & (byte)cVar32 &
                                (byte)cVar31 & (byte)uVar29 & (byte)cVar30 & (byte)cVar34);
        }
        pcVar53 = cJSON_CreateObject();
        uVar58 = cJSON_AddItemToObject(object,"constants",pcVar53);
        pcVar54 = cJSON_CreateNumber(1e-06);
        uVar6 = cJSON_AddItemToObject(pcVar53,"COST_TOLERANCE",pcVar54);
        if ((((uVar29 & 1) == 0) || ((uVar58 & 1) == 0)) || ((uVar6 & 1) == 0)) {
          log_log(0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/main.c"
                  ,0x133,
                  "%s :: Failed to add all the necessary JSON elements to the parent JSON root object"
                  ,"writeout_json_report");
        }
        else {
          pcVar55 = cJSON_Print(object);
          fputs(pcVar55,pFVar52);
          free(pcVar55);
        }
      }
      if (object != (cJSON *)0x0) {
        cJSON_Delete(object);
      }
      if (pFVar52 != (FILE *)0x0) {
        fclose(pFVar52);
      }
    }
    if (filepath != (char *)0x0) {
      render_tour_image(filepath,&local_2128,&local_2150.tour,(char *)0x0);
    }
  }
  instance_destroy(&local_2128);
  solution_destroy(&local_2150);
  uVar58 = (byte)(bVar57 | (byte)SVar3 | bVar61) & 1;
LAB_00103b52:
  arg_freetable(&local_20a8,0xd);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return uVar58;
}

Assistant:

int main(int argc, char **argv) {
    const char *progname = argv[0];
    FILE *log_file_handle = NULL;

    if (argc == 1) {
        print_brief_description(progname);
        print_version();
        printf("\n");
        print_use_help_for_more_information(progname);
        return EXIT_FAILURE;
    }

    struct arg_dbl *timelimit = arg_dbl0(
        "t", "timelimit", NULL,
        "define the maximum timelimit in seconds (default 10 minutes)");
    struct arg_int *randomseed =
        arg_int0("s", "seed", NULL,
                 "define the random seed to use (default is 0, eg compute it "
                 "from the current time)");
    struct arg_lit *treat_sigterm_as_failure =
        arg_lit0("a", "treat-sigterm-as-failure",
                 "treat SIGTERM/SIGINT (CTRL-C) abortion as failure and exit "
                 "with non zero exit status. The JSON report output file will "
                 "not be generated");
    struct arg_str *defines =
        arg_strn("D", "define", "KEY=VALUE", 0, argc + 2, "define parameters");
    struct arg_str *solver =
        arg_str0("S", "solver", "SOLVER", "solver to use (default \"mip\")");
    struct arg_int *loglvl =
        arg_int0(NULL, "loglvl", NULL,
                 "control the log level (0: fatal&warning logs, 1: info logs, "
                 "2: trace logs, 3: debug logs (only in debug builds)");
    struct arg_file *logfile =
        arg_file0("l", "log", NULL,
                  "specify an additional file where logs would be "
                  "stored (default none)");
    struct arg_lit *help = arg_lit0(NULL, "help", "print this help and exit");
    struct arg_lit *version =
        arg_lit0(NULL, "version", "print version information and exit");
    struct arg_file *instance =
        arg_file1("i", "instance", NULL, "input instance file");

    struct arg_file *vis_path =
        arg_file0(NULL, "visualize", NULL, "tour visualization output file");
    struct arg_file *json_report_path = arg_file0(
        "w", "write-report", NULL, "write a JSON report output file.");

    struct arg_end *end = arg_end(MAX_NUMBER_OF_ERRORS_TO_DISPLAY);

    void *argtable[] = {help,
                        version,
                        loglvl,
                        logfile,
                        treat_sigterm_as_failure,
                        timelimit,
                        randomseed,
                        defines,
                        instance,
                        vis_path,
                        json_report_path,
                        solver,
                        end};

    int exitcode = 0;

    /* verify the argtable[] entries were allocated successfully */
    if (arg_nullcheck(argtable) != 0) {
        printf("%s: insufficient memory\n", progname);
        exitcode = 1;
        goto exit;
    }

    // Default time limit
    timelimit->dval[0] = DEFAULT_TIME_LIMIT;
    // Default random seed
    randomseed->ival[0] = 0;
    // Default solver
    solver->sval[0] = "mip";
    // No logging file by default
    logfile->filename[0] = NULL;
    // No tour visualization file by default
    vis_path->filename[0] = NULL;
    // No JSON report output file by default
    json_report_path->filename[0] = NULL;
    // Contain only fatal&warning log messages by default
    loglvl->ival[0] = 0;

    {
        int nerrors = arg_parse(argc, argv, argtable);

        /* special case: '--help' takes precedence over error reporting */
        if (help->count > 0) {
            print_brief_description(progname);
            printf("Usage: %s", progname);
            arg_print_syntax(stdout, argtable, "\n");
            arg_print_glossary(stdout, argtable, "  %-32s %s\n");
            cptp_print_list_of_solvers_and_params();
            exitcode = 0;
            goto exit;
        }

        if (nerrors > 0) {
            arg_print_errors(stdout, end, progname);
            print_use_help_for_more_information(progname);
            exitcode = 1;
            goto exit;
        }
    }

    /* special case: '--version' takes precedence error reporting */
    if (version->count > 0) {
        print_version();
        exitcode = 0;
        goto exit;
    }

    int32_t iloglvl = LOG_WARN;
    if (loglvl->ival[0] <= 0) {
        iloglvl = LOG_WARN;
    } else if (loglvl->ival[0] == 1) {
        iloglvl = LOG_INFO;
    } else if (loglvl->ival[0] == 2) {
        iloglvl = LOG_TRACE;
    } else {
        iloglvl = LOG_DEBUG;
    }

    log_set_level(iloglvl);

    if (logfile->count > 0) {
        log_file_handle = fopen(logfile->filename[0], "w");
        if (log_file_handle) {
            log_add_fp(log_file_handle, iloglvl);
        } else {
            fprintf(stderr, "%s: Failed to open for logging\n",
                    logfile->filename[0]);
        }
    }

    AppCtx ctx = {.loglvl = iloglvl,
                  .instance_filepath = instance->filename[0],
                  .treat_sigterm_as_failure =
                      treat_sigterm_as_failure->count > 0,
                  .solver = solver->sval[0],
                  .timelimit = timelimit->dval[0],
                  .randomseed = randomseed->ival[0],
                  .defines = defines->sval,
                  .num_defines = defines->count,
                  .vis_path = vis_path->filename[0],
                  .json_report_path = json_report_path->filename[0]};

    if (ctx.randomseed == 0) {
        ctx.randomseed = (int32_t)(time(NULL) % INT32_MAX);
    }

    exitcode = main2(&ctx);

exit:
    arg_freetable(argtable, ARRAY_LEN(argtable));

    if (log_file_handle) {
        fclose(log_file_handle);
        log_file_handle = NULL;
    }

    return exitcode;
}